

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O2

void __thiscall avro::ArraySchema::ArraySchema(ArraySchema *this,Schema *itemsSchema)

{
  Node *node;
  
  node = (Node *)operator_new(0x28);
  node->type_ = AVRO_ARRAY;
  node->locked_ = false;
  node[1]._vptr_Node = (_func_int **)0x0;
  node[1].type_ = AVRO_STRING;
  node[1].locked_ = false;
  *(undefined3 *)&node[1].field_0xd = 0;
  node->_vptr_Node = (_func_int **)&PTR__NodeImpl_001a3148;
  Schema::Schema(&this->super_Schema,node);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001a4530;
  Node::addLeaf((this->super_Schema).node_.px,&itemsSchema->node_);
  return;
}

Assistant:

ArraySchema::ArraySchema(const Schema &itemsSchema) :
    Schema(new NodeArray)
{
    node_->addLeaf(itemsSchema.root());
}